

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.hpp
# Opt level: O0

bool adiak::
     value<std::vector<std::tuple<char_const*,int>,std::allocator<std::tuple<char_const*,int>>>>
               (string *name,
               vector<std::tuple<const_char_*,_int>,_std::allocator<std::tuple<const_char_*,_int>_>_>
               *value,int category,string *subcategory)

{
  bool bVar1;
  int iVar2;
  adiak_datatype_t *dtype;
  adiak_value_t *value_00;
  char *name_00;
  char *subcategory_00;
  bool result;
  adiak_value_t *avalue;
  adiak_datatype_t *datatype;
  string *subcategory_local;
  int category_local;
  vector<std::tuple<const_char_*,_int>,_std::allocator<std::tuple<const_char_*,_int>_>_>
  *value_local;
  string *name_local;
  
  dtype = internal::
          parse<std::vector<std::tuple<const_char_*,_int>,_std::allocator<std::tuple<const_char_*,_int>_>_>_>
          ::make_type();
  if (dtype == (adiak_datatype_t *)0x0) {
    name_local._7_1_ = false;
  }
  else {
    value_00 = (adiak_value_t *)malloc(8);
    bVar1 = internal::
            parse<std::vector<std::tuple<const_char_*,_int>,_std::allocator<std::tuple<const_char_*,_int>_>_>_>
            ::make_value(value,value_00,dtype);
    if (bVar1) {
      name_00 = (char *)std::__cxx11::string::c_str();
      subcategory_00 = (char *)std::__cxx11::string::c_str();
      iVar2 = adiak_raw_namevalue(name_00,category,subcategory_00,value_00,dtype);
      name_local._7_1_ = iVar2 == 0;
    }
    else {
      name_local._7_1_ = false;
    }
  }
  return name_local._7_1_;
}

Assistant:

bool value(std::string name, T value, int category = adiak_general, std::string subcategory = "") {
      adiak_datatype_t *datatype = adiak::internal::parse<T>::make_type();
      if (!datatype)
         return false;
      adiak_value_t *avalue = (adiak_value_t *) malloc(sizeof(adiak_value_t));
      bool result = adiak::internal::parse<T>::make_value(value, avalue, datatype);
      if (!result)
         return false;
      return adiak_raw_namevalue(name.c_str(), category, subcategory.c_str(), avalue, datatype) == 0;
   }